

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O3

void xml_node_free(xml_node *node)

{
  xml_node *node_00;
  xml_attribute **__ptr;
  xml_node **__ptr_00;
  xml_attribute *__ptr_01;
  
  free(node->name);
  if (node->content != (xml_string *)0x0) {
    free(node->content);
  }
  __ptr = node->attributes;
  __ptr_01 = *__ptr;
  if (__ptr_01 != (xml_attribute *)0x0) {
    do {
      __ptr = __ptr + 1;
      if (__ptr_01->name != (xml_string *)0x0) {
        free(__ptr_01->name);
      }
      if (__ptr_01->content != (xml_string *)0x0) {
        free(__ptr_01->content);
      }
      free(__ptr_01);
      __ptr_01 = *__ptr;
    } while (__ptr_01 != (xml_attribute *)0x0);
    __ptr = node->attributes;
  }
  free(__ptr);
  __ptr_00 = node->children;
  node_00 = *__ptr_00;
  if (node_00 != (xml_node *)0x0) {
    do {
      __ptr_00 = __ptr_00 + 1;
      xml_node_free(node_00);
      node_00 = *__ptr_00;
    } while (node_00 != (xml_node *)0x0);
    __ptr_00 = node->children;
  }
  free(__ptr_00);
  free(node);
  return;
}

Assistant:

static void xml_node_free(struct xml_node* node) {
	xml_string_free(node->name);

	if (node->content) {
		xml_string_free(node->content);
	}

	struct xml_attribute** at = node->attributes;
	while(*at) {
		xml_attribute_free(*at);
		++at;
	}
	free(node->attributes);

	struct xml_node** it = node->children;
	while (*it) {
		xml_node_free(*it);
		++it;
	}
	free(node->children);

	free(node);
}